

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportwriter.cpp
# Opt level: O0

void __thiscall ReportWriter::writeLinkHeader(ReportWriter *this)

{
  ostream *poVar1;
  undefined1 local_e8 [40];
  undefined1 local_c0 [40];
  undefined1 local_98 [40];
  undefined1 local_70 [64];
  string local_30 [8];
  string s1;
  ReportWriter *this_local;
  
  std::ostream::operator<<(this->sout,std::left);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,0x48,'-',(allocator *)(local_70 + 0x3f));
  std::allocator<char>::~allocator((allocator<char> *)(local_70 + 0x3f));
  poVar1 = std::operator<<((ostream *)this->sout,"  ");
  poVar1 = std::operator<<(poVar1,local_30);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)this->sout;
  local_70._40_4_ = std::setw(0x1a);
  poVar1 = std::operator<<(poVar1,(_Setw)local_70._40_4_);
  std::operator<<(poVar1," ");
  poVar1 = std::operator<<((ostream *)this->sout,
                           "   Flow Rate     Leakage    Velocity   Head Loss      Status");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)this->sout;
  local_70._36_4_ = std::setw(0x1a);
  poVar1 = std::operator<<(poVar1,(_Setw)local_70._36_4_);
  std::operator<<(poVar1,"  Link");
  std::ostream::operator<<(this->sout,std::right);
  poVar1 = (ostream *)this->sout;
  local_70._32_4_ = std::setw(0xc);
  poVar1 = std::operator<<(poVar1,(_Setw)local_70._32_4_);
  Network::getUnits_abi_cxx11_((Network *)local_70,(Quantity)this->network);
  std::operator<<(poVar1,(string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  poVar1 = (ostream *)this->sout;
  local_98._36_4_ = std::setw(0xc);
  poVar1 = std::operator<<(poVar1,(_Setw)local_98._36_4_);
  Network::getUnits_abi_cxx11_((Network *)local_98,(Quantity)this->network);
  std::operator<<(poVar1,(string *)local_98);
  std::__cxx11::string::~string((string *)local_98);
  poVar1 = (ostream *)this->sout;
  local_c0._36_4_ = std::setw(0xc);
  poVar1 = std::operator<<(poVar1,(_Setw)local_c0._36_4_);
  Network::getUnits_abi_cxx11_((Network *)local_c0,(Quantity)this->network);
  std::operator<<(poVar1,(string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  poVar1 = (ostream *)this->sout;
  local_e8._36_4_ = std::setw(0xc);
  poVar1 = std::operator<<(poVar1,(_Setw)local_e8._36_4_);
  Network::getUnits_abi_cxx11_((Network *)local_e8,(Quantity)this->network);
  poVar1 = std::operator<<(poVar1,(string *)local_e8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_e8);
  std::ostream::operator<<(this->sout,std::left);
  poVar1 = std::operator<<((ostream *)this->sout,"  ");
  poVar1 = std::operator<<(poVar1,local_30);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void ReportWriter::writeLinkHeader()
{
    sout << left;
    string s1(72, '-');
    sout << "  " << s1 << endl;
    sout << setw(26) << " ";
    sout << "   Flow Rate     Leakage    Velocity   Head Loss      Status" << endl;

    sout << setw(26) << "  Link";
    sout << right;
    sout << setw(12) << network->getUnits(Units::FLOW);
    sout << setw(12) << network->getUnits(Units::FLOW);
    sout << setw(12) << network->getUnits(Units::VELOCITY);
    sout << setw(12) << network->getUnits(Units::HEADLOSS) << endl;

    sout << left;
    sout << "  " << s1 << endl;
}